

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffm_score.cc
# Opt level: O2

void __thiscall
xLearn::FFMScore::calc_grad_sgd(FFMScore *this,SparseRow *row,Model *model,real_t pg,real_t norm)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  real_t *prVar5;
  float fVar6;
  pointer pNVar7;
  ulong uVar8;
  index_t d;
  uint uVar9;
  pointer pNVar10;
  pointer pNVar11;
  int iVar12;
  uint uVar13;
  pointer pNVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar21 [64];
  undefined1 in_register_00001244 [60];
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar26 [16];
  
  auVar25 = in_ZMM4._0_16_;
  auVar22._4_60_ = in_register_00001244;
  auVar22._0_4_ = norm;
  auVar21._4_60_ = in_register_00001204;
  auVar21._0_4_ = pg;
  auVar20 = auVar21._0_16_;
  if (norm < 0.0) {
    fVar19 = sqrtf(norm);
    auVar20 = ZEXT416((uint)pg);
    auVar22 = ZEXT464((uint)norm);
  }
  else {
    auVar23 = vsqrtss_avx(auVar22._0_16_,auVar22._0_16_);
    fVar19 = auVar23._0_4_;
  }
  prVar5 = model->param_w_;
  uVar3 = model->num_feat_;
  uVar4 = model->num_field_;
  pNVar11 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  pNVar7 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (pNVar14 = pNVar7; pNVar14 != pNVar11; pNVar14 = pNVar14 + 1) {
    uVar13 = pNVar14->feat_id;
    if (uVar13 < uVar3) {
      auVar24 = ZEXT416((uint)prVar5[uVar13]);
      auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar19 * auVar20._0_4_ * pNVar14->feat_val)),auVar24,
                                ZEXT416((uint)(this->super_Score).regu_lambda_));
      auVar23 = vfnmadd132ss_fma(auVar23,auVar24,ZEXT416((uint)(this->super_Score).learning_rate_));
      prVar5[uVar13] = auVar23._0_4_;
    }
  }
  auVar23 = vfnmadd213ss_fma(ZEXT416((uint)(this->super_Score).learning_rate_),auVar20,
                             ZEXT416((uint)*model->param_b_));
  *model->param_b_ = auVar23._0_4_;
  auVar24 = vcvtusi2ss_avx512f(auVar25,model->aux_size_);
  fVar19 = (this->super_Score).regu_lambda_;
  prVar5 = model->param_v_;
  auVar23 = vcvtusi2ss_avx512f(auVar25,model->num_K_);
  auVar23 = ZEXT416((uint)(auVar23._0_4_ * 0.25));
  auVar23 = vroundss_avx(auVar23,auVar23,10);
  iVar12 = vcvttss2usi_avx512f(auVar23);
  auVar25 = vcvtusi2ss_avx512f(auVar25,iVar12 << 2);
  uVar13 = vcvttss2usi_avx512f(ZEXT416((uint)(auVar24._0_4_ * auVar25._0_4_)));
  iVar12 = vcvttss2usi_avx512f(ZEXT416((uint)(auVar24._0_4_ * 4.0)));
  fVar1 = (this->super_Score).learning_rate_;
  for (; pNVar7 != pNVar11; pNVar7 = pNVar7 + 1) {
    if (pNVar7->field_id < uVar4 && pNVar7->feat_id < uVar3) {
      fVar2 = pNVar7->feat_val;
      uVar15 = (ulong)(pNVar7->feat_id * uVar4 * uVar13);
      uVar18 = (ulong)(pNVar7->field_id * uVar13);
      pNVar14 = pNVar7;
      while (pNVar10 = pNVar14, pNVar14 = pNVar10 + 1, pNVar14 != pNVar11) {
        if (pNVar10[1].field_id < uVar4 && pNVar10[1].feat_id < uVar3) {
          uVar16 = (ulong)(pNVar10[1].feat_id * uVar4 * uVar13);
          uVar17 = (ulong)(pNVar10[1].field_id * uVar13);
          uVar9 = 0;
          fVar6 = auVar20._0_4_ * fVar2 * pNVar10[1].feat_val * auVar22._0_4_;
          while (uVar9 < uVar13) {
            uVar8 = (ulong)uVar9;
            auVar25 = *(undefined1 (*) [16])(prVar5 + uVar15 + uVar17 + uVar8);
            auVar23 = *(undefined1 (*) [16])(prVar5 + uVar18 + uVar16 + uVar8);
            uVar9 = uVar9 + iVar12;
            auVar24._0_4_ = fVar1 * (fVar19 * auVar25._0_4_ + fVar6 * auVar23._0_4_);
            auVar24._4_4_ = fVar1 * (fVar19 * auVar25._4_4_ + fVar6 * auVar23._4_4_);
            auVar24._8_4_ = fVar1 * (fVar19 * auVar25._8_4_ + fVar6 * auVar23._8_4_);
            auVar24._12_4_ = fVar1 * (fVar19 * auVar25._12_4_ + fVar6 * auVar23._12_4_);
            auVar26._0_4_ = fVar1 * (fVar6 * auVar25._0_4_ + fVar19 * auVar23._0_4_);
            auVar26._4_4_ = fVar1 * (fVar6 * auVar25._4_4_ + fVar19 * auVar23._4_4_);
            auVar26._8_4_ = fVar1 * (fVar6 * auVar25._8_4_ + fVar19 * auVar23._8_4_);
            auVar26._12_4_ = fVar1 * (fVar6 * auVar25._12_4_ + fVar19 * auVar23._12_4_);
            auVar25 = vsubps_avx(auVar25,auVar24);
            auVar23 = vsubps_avx(auVar23,auVar26);
            *(undefined1 (*) [16])(prVar5 + uVar15 + uVar17 + uVar8) = auVar25;
            *(undefined1 (*) [16])(prVar5 + uVar18 + uVar16 + uVar8) = auVar23;
          }
          pNVar11 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
        }
      }
    }
  }
  return;
}

Assistant:

void FFMScore::calc_grad_sgd(const SparseRow* row,
                             Model& model,
                             real_t pg,
                             real_t norm) {
  /*********************************************************
   *  linear term and bias term                            *
   *********************************************************/
  real_t sqrt_norm = sqrt(norm);
  real_t *w = model.GetParameter_w();
  index_t num_feat = model.GetNumFeature();
  index_t num_field = model.GetNumField();
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t feat_id = iter->feat_id;
    // To avoid unseen feature
    if (feat_id >= num_feat) continue;
    real_t &wl = w[feat_id];
    real_t g = regu_lambda_*wl+pg*iter->feat_val*sqrt_norm;
    wl -= (learning_rate_ * g);
  }
  // bias
  w = model.GetParameter_b();
  real_t &wb = w[0];
  real_t g = pg;
  wb -= (learning_rate_ * g);
  /*********************************************************
   *  latent factor                                        *
   *********************************************************/
  index_t align0 = model.GetAuxiliarySize() * model.get_aligned_k();
  index_t align1 = model.GetNumField() * align0;
  index_t align = kAlign * model.GetAuxiliarySize();
  w = model.GetParameter_v();
  __m128 XMMpg = _mm_set1_ps(pg);
  __m128 XMMlr = _mm_set1_ps(learning_rate_);
  __m128 XMMlamb = _mm_set1_ps(regu_lambda_);
  for (SparseRow::const_iterator iter_i = row->begin();
       iter_i != row->end(); ++iter_i) {
    index_t j1 = iter_i->feat_id;
    index_t f1 = iter_i->field_id;
    // To avoid unseen feature
    if (j1 >= num_feat || f1 >= num_field) continue;
    real_t v1 = iter_i->feat_val;
    for (SparseRow::const_iterator iter_j = iter_i+1;
         iter_j != row->end(); ++iter_j) {
      index_t j2 = iter_j->feat_id;
      index_t f2 = iter_j->field_id;
      // To avoid unseen feature
      if (j2 >= num_feat || f2 >= num_field) continue;
      real_t v2 = iter_j->feat_val;
      real_t* w1_base = w + j1*align1 + f2*align0;
      real_t* w2_base = w + j2*align1 + f1*align0;
      __m128 XMMv = _mm_set1_ps(v1*v2*norm);
      __m128 XMMpgv = _mm_mul_ps(XMMv, XMMpg);
      for (index_t d = 0; d < align0; d += align) {
        real_t *w1 = w1_base + d;
        real_t *w2 = w2_base + d;
        __m128 XMMw1 = _mm_load_ps(w1);
        __m128 XMMw2 = _mm_load_ps(w2);
        __m128 XMMg1 = _mm_add_ps(
                       _mm_mul_ps(XMMlamb, XMMw1),
                       _mm_mul_ps(XMMpgv, XMMw2));
        __m128 XMMg2 = _mm_add_ps(
                       _mm_mul_ps(XMMlamb, XMMw2),
                       _mm_mul_ps(XMMpgv, XMMw1));
        XMMw1 = _mm_sub_ps(XMMw1, _mm_mul_ps(XMMlr, XMMg1));
        XMMw2 = _mm_sub_ps(XMMw2, _mm_mul_ps(XMMlr, XMMg2));
        _mm_store_ps(w1, XMMw1);
        _mm_store_ps(w2, XMMw2);
      }
    }
  }

}